

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

double __thiscall
chrono::fea::ChElementBeamANCF_3243::GetVonMissesStress
          (ChElementBeamANCF_3243 *this,double xi,double eta,double zeta)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  Matrix3xN *pMVar20;
  double *pdVar21;
  Index row;
  long lVar22;
  undefined1 (*pauVar23) [64];
  ActualDstType actualDst;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar30 [32];
  undefined1 auVar34 [64];
  undefined1 auVar31 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar58;
  double dVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_3,_3> SPK2;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> S;
  Matrix3xN e_bar;
  double local_570;
  double dStack_568;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  double dStack_548;
  double local_540 [4];
  double dStack_520;
  double local_518;
  double local_510;
  double dStack_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0 [6];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  double local_490;
  double dStack_488;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  double local_460 [6];
  double dStack_430;
  double local_428;
  double local_420;
  double adStack_418 [2];
  Matrix<double,_3,_3,_1,_3,_3> local_408;
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  assign_op<double,_double> *local_2f0;
  double *local_2e8;
  assign_op<double,_double> *local_2e0;
  double local_2d0;
  undefined1 local_2c0 [16];
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double *pdStack_270;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_268;
  double dStack_260;
  undefined1 auStack_258 [24];
  undefined1 local_240 [64];
  ChMatrix33<double> local_188;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pdVar21 = (double *)local_3c0;
  Calc_Sxi_D(this,(MatrixNx3c *)pdVar21,xi,eta,zeta);
  pMVar20 = &this->m_ebar0;
  lVar22 = 0x10;
  do {
    auVar34 = *(undefined1 (*) [64])
               (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array;
    auVar32 = vmulpd_avx512f(auVar34,local_3c0);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    auVar33 = vmulpd_avx512f(auVar34,local_380);
    auVar30 = vextractf64x4_avx512f(auVar33,1);
    auVar34 = vmulpd_avx512f(auVar34,local_340);
    auVar31 = vextractf64x4_avx512f(auVar34,1);
    dVar52 = auVar34._0_8_ + auVar31._0_8_ + auVar34._8_8_ + auVar31._8_8_;
    dVar58 = auVar34._16_8_ + auVar31._16_8_ + auVar34._24_8_ + auVar31._24_8_;
    auVar28._0_8_ = dVar52 + dVar58;
    auVar28._8_8_ = dVar52 + dVar58;
    *(double *)((long)adStack_418 + lVar22) =
         auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_ +
         auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    *(double *)
     ((long)local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar22 + -8) =
         auVar33._0_8_ + auVar30._0_8_ + auVar33._8_8_ + auVar30._8_8_ +
         auVar33._16_8_ + auVar30._16_8_ + auVar33._24_8_ + auVar30._24_8_;
    uVar1 = vmovlpd_avx(auVar28);
    *(undefined8 *)
     ((long)local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar22) = uVar1;
    lVar22 = lVar22 + 0x18;
    pMVar20 = (Matrix3xN *)
              ((pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array + 8);
  } while (lVar22 != 0x58);
  local_140._8_8_ = &local_408;
  local_2c0._0_8_ = pdVar21;
  local_140._0_8_ = pdVar21;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_2c0 + 8),(SrcXprType *)(local_140 + 8),
        (assign_op<double,_double> *)local_540);
  pdStack_270 = (double *)local_2c0._0_8_;
  dStack_260 = 1.48219693752374e-323;
  auVar34 = *(undefined1 (*) [64])local_2c0._0_8_;
  auVar32._8_8_ = local_2c0._8_8_;
  auVar32._0_8_ = local_2c0._8_8_;
  auVar32._16_8_ = local_2c0._8_8_;
  auVar32._24_8_ = local_2c0._8_8_;
  auVar32._32_8_ = local_2c0._8_8_;
  auVar32._40_8_ = local_2c0._8_8_;
  auVar32._48_8_ = local_2c0._8_8_;
  auVar32._56_8_ = local_2c0._8_8_;
  auVar35 = vmulpd_avx512f(auVar34,auVar32);
  auVar32 = *(undefined1 (*) [64])(local_2c0._0_8_ + 0x40);
  auVar33 = *(undefined1 (*) [64])(local_2c0._0_8_ + 0x80);
  auVar36._8_8_ = dStack_2a0;
  auVar36._0_8_ = dStack_2a0;
  auVar36._16_8_ = dStack_2a0;
  auVar36._24_8_ = dStack_2a0;
  auVar36._32_8_ = dStack_2a0;
  auVar36._40_8_ = dStack_2a0;
  auVar36._48_8_ = dStack_2a0;
  auVar36._56_8_ = dStack_2a0;
  auVar36 = vfmadd231pd_avx512f(auVar35,auVar32,auVar36);
  auVar35._8_8_ = dStack_288;
  auVar35._0_8_ = dStack_288;
  auVar35._16_8_ = dStack_288;
  auVar35._24_8_ = dStack_288;
  auVar35._32_8_ = dStack_288;
  auVar35._40_8_ = dStack_288;
  auVar35._48_8_ = dStack_288;
  auVar35._56_8_ = dStack_288;
  local_3c0 = vfmadd231pd_avx512f(auVar36,auVar33,auVar35);
  auVar9._8_8_ = dStack_2b0;
  auVar9._0_8_ = dStack_2b0;
  auVar9._16_8_ = dStack_2b0;
  auVar9._24_8_ = dStack_2b0;
  auVar9._32_8_ = dStack_2b0;
  auVar9._40_8_ = dStack_2b0;
  auVar9._48_8_ = dStack_2b0;
  auVar9._56_8_ = dStack_2b0;
  auVar36 = vmulpd_avx512f(auVar34,auVar9);
  auVar10._8_8_ = dStack_298;
  auVar10._0_8_ = dStack_298;
  auVar10._16_8_ = dStack_298;
  auVar10._24_8_ = dStack_298;
  auVar10._32_8_ = dStack_298;
  auVar10._40_8_ = dStack_298;
  auVar10._48_8_ = dStack_298;
  auVar10._56_8_ = dStack_298;
  auVar36 = vfmadd231pd_avx512f(auVar36,auVar32,auVar10);
  auVar11._8_8_ = local_280;
  auVar11._0_8_ = local_280;
  auVar11._16_8_ = local_280;
  auVar11._24_8_ = local_280;
  auVar11._32_8_ = local_280;
  auVar11._40_8_ = local_280;
  auVar11._48_8_ = local_280;
  auVar11._56_8_ = local_280;
  local_380 = vfmadd231pd_avx512f(auVar36,auVar33,auVar11);
  auVar12._8_8_ = dStack_2a8;
  auVar12._0_8_ = dStack_2a8;
  auVar12._16_8_ = dStack_2a8;
  auVar12._24_8_ = dStack_2a8;
  auVar12._32_8_ = dStack_2a8;
  auVar12._40_8_ = dStack_2a8;
  auVar12._48_8_ = dStack_2a8;
  auVar12._56_8_ = dStack_2a8;
  auVar36 = vmulpd_avx512f(auVar34,auVar12);
  auVar34._8_8_ = dStack_290;
  auVar34._0_8_ = dStack_290;
  auVar34._16_8_ = dStack_290;
  auVar34._24_8_ = dStack_290;
  auVar34._32_8_ = dStack_290;
  auVar34._40_8_ = dStack_290;
  auVar34._48_8_ = dStack_290;
  auVar34._56_8_ = dStack_290;
  auVar34 = vfmadd231pd_avx512f(auVar36,auVar32,auVar34);
  auVar13._8_8_ = dStack_278;
  auVar13._0_8_ = dStack_278;
  auVar13._16_8_ = dStack_278;
  auVar13._24_8_ = dStack_278;
  auVar13._32_8_ = dStack_278;
  auVar13._40_8_ = dStack_278;
  auVar13._48_8_ = dStack_278;
  auVar13._56_8_ = dStack_278;
  local_340 = vfmadd231pd_avx512f(auVar34,auVar33,auVar13);
  pMStack_268 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_2c0 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar33._8_8_ = local_140._8_8_;
  auVar33._0_8_ = local_140._0_8_;
  auVar33._16_48_ = local_140._16_48_;
  lVar22 = 0x10;
  do {
    auVar34 = *(undefined1 (*) [64])pdVar21;
    auVar32 = vmulpd_avx512f(auVar33,auVar34);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    auVar36 = vmulpd_avx512f(auVar34,local_100);
    auVar30 = vextractf64x4_avx512f(auVar36,1);
    auVar34 = vmulpd_avx512f(auVar34,local_c0);
    auVar31 = vextractf64x4_avx512f(auVar34,1);
    dVar52 = auVar34._0_8_ + auVar31._0_8_ + auVar34._8_8_ + auVar31._8_8_;
    dVar58 = auVar34._16_8_ + auVar31._16_8_ + auVar34._24_8_ + auVar31._24_8_;
    auVar27._0_8_ = dVar52 + dVar58;
    auVar27._8_8_ = dVar52 + dVar58;
    *(double *)(local_550 + lVar22) =
         auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_ +
         auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    dVar52 = local_540[0];
    *(double *)(local_550 + lVar22 + 8) =
         auVar36._0_8_ + auVar30._0_8_ + auVar36._8_8_ + auVar30._8_8_ +
         auVar36._16_8_ + auVar30._16_8_ + auVar36._24_8_ + auVar30._24_8_;
    dVar58 = local_540[1];
    uVar1 = vmovlpd_avx(auVar27);
    *(undefined8 *)((long)local_540 + lVar22) = uVar1;
    lVar22 = lVar22 + 0x18;
    pdVar21 = pdVar21 + 8;
  } while (lVar22 != 0x58);
  dVar8 = local_500 * local_518 + local_510 * local_540[3] + dStack_508 * dStack_520;
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (local_518 * local_518 + local_540[3] * local_540[3] + dStack_520 * dStack_520 + -1.0) * 0.5;
  dStack_548 = 0.0;
  local_550 = (undefined1  [8])
              ((local_540[2] * local_540[2] +
                local_540[0] * local_540[0] + local_540[1] * local_540[1] + -1.0) * 0.5);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (local_500 * local_500 + local_510 * local_510 + dStack_508 * dStack_508 + -1.0) * 0.5;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar8;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_500 * local_540[2] + local_510 * local_540[0] + dStack_508 * local_540[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_540[2] * local_518 + local_540[0] * local_540[3] + local_540[1] * dStack_520
  ;
  if (this->m_damping_enabled == true) {
    local_4f8 = local_500;
    local_490 = local_510;
    dStack_488 = dStack_508;
    local_4f0 = local_518;
    local_460[0] = local_540[3];
    local_460[1] = dStack_520;
    local_4e8 = local_540[2];
    local_4b0 = auVar68;
    local_4a0 = auVar67;
    local_480 = auVar25;
    local_470 = auVar24;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_2c0);
    auVar18._8_8_ = local_2c0._8_8_;
    auVar18._0_8_ = local_2c0._0_8_;
    auVar18._16_8_ = dStack_2b0;
    auVar18._24_8_ = dStack_2a8;
    auVar18._32_8_ = dStack_2a0;
    auVar18._40_8_ = dStack_298;
    auVar18._48_8_ = dStack_290;
    auVar18._56_8_ = dStack_288;
    auVar19._8_8_ = dStack_278;
    auVar19._0_8_ = local_280;
    auVar19._16_8_ = pdStack_270;
    auVar19._24_8_ = pMStack_268;
    auVar19._32_8_ = dStack_260;
    auVar19._40_24_ = auStack_258;
    lVar22 = 0x10;
    pauVar23 = &local_3c0;
    do {
      auVar34 = *pauVar23;
      auVar32 = vmulpd_avx512f(auVar18,auVar34);
      auVar29 = vextractf64x4_avx512f(auVar32,1);
      auVar33 = vmulpd_avx512f(auVar34,auVar19);
      auVar30 = vextractf64x4_avx512f(auVar33,1);
      auVar34 = vmulpd_avx512f(auVar34,local_240);
      auVar31 = vextractf64x4_avx512f(auVar34,1);
      dVar53 = auVar34._0_8_ + auVar31._0_8_ + auVar34._8_8_ + auVar31._8_8_;
      dVar59 = auVar34._16_8_ + auVar31._16_8_ + auVar34._24_8_ + auVar31._24_8_;
      auVar54._0_8_ = dVar53 + dVar59;
      auVar54._8_8_ = dVar53 + dVar59;
      *(double *)((long)local_460 + lVar22) =
           auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_ +
           auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
      *(double *)((long)local_460 + lVar22 + 8) =
           auVar33._0_8_ + auVar30._0_8_ + auVar33._8_8_ + auVar30._8_8_ +
           auVar33._16_8_ + auVar30._16_8_ + auVar33._24_8_ + auVar30._24_8_;
      uVar1 = vmovlpd_avx(auVar54);
      *(undefined8 *)((long)local_460 + lVar22 + 0x10) = uVar1;
      lVar22 = lVar22 + 0x18;
      pauVar23 = pauVar23 + 1;
    } while (lVar22 != 0x58);
    auVar15._8_8_ = local_460[3];
    auVar15._0_8_ = local_460[2];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_460[4];
    auVar16._8_8_ = dStack_430;
    auVar16._0_8_ = local_460[5];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = this->m_Alpha;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_550;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_4e8 * local_460[4] + dVar52 * local_460[2] + dVar58 * local_460[3];
    auVar28 = vfmadd213sd_fma(auVar44,auVar62,auVar2);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_428;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_4b0._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_4f0 * local_428 + local_460[0] * local_460[5] + local_460[1] * dStack_430;
    auVar27 = vfmadd213sd_fma(auVar60,auVar62,auVar3);
    auVar17._8_8_ = adStack_418[0];
    auVar17._0_8_ = local_420;
    auVar14._8_8_ = dStack_488;
    auVar14._0_8_ = local_490;
    auVar24 = vmulpd_avx512vl(auVar14,auVar17);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = adStack_418[1];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_4f8;
    auVar25 = vmulsd_avx512f(auVar69,auVar66);
    auVar26 = vmulpd_avx512vl(auVar14,auVar16);
    _local_550 = vunpcklpd_avx(auVar28,auVar27);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_4a0._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auVar25._0_8_ + auVar24._0_8_ + auVar24._8_8_;
    auVar28 = vfmadd213sd_fma(auVar65,auVar62,auVar4);
    auVar27 = vmulsd_avx512f(auVar69,auVar64);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar8;
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         local_4f0 * adStack_418[1] + local_460[0] * local_420 + local_460[1] * adStack_418[0] +
         auVar26._0_8_ + auVar26._8_8_ + auVar27._0_8_;
    auVar27 = vfmadd213sd_fma(auVar45,auVar62,auVar5);
    local_560 = vunpcklpd_avx(auVar28,auVar27);
    auVar28 = vmulpd_avx512vl(auVar14,auVar15);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_4f8;
    auVar27 = vmulsd_avx512f(auVar70,auVar49);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_480._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         auVar27._0_8_ + auVar28._0_8_ + auVar28._8_8_ +
         local_4e8 * adStack_418[1] + dVar52 * local_420 + dVar58 * adStack_418[0];
    auVar28 = vfmadd213sd_fma(auVar46,auVar62,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_470._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         local_4f0 * local_460[4] + local_460[0] * local_460[2] + local_460[1] * local_460[3] +
         local_4e8 * local_428 + dVar52 * local_460[5] + dVar58 * dStack_430;
    auVar27 = vfmadd213sd_fma(auVar37,auVar62,auVar7);
    auVar28 = vunpcklpd_avx(auVar28,auVar27);
  }
  else {
    _local_550 = vunpcklpd_avx(_local_550,auVar68);
    local_560 = vunpcklpd_avx(auVar67,auVar26);
    auVar28 = vunpcklpd_avx(auVar25,auVar24);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,(ChMatrixNM<double,_6,_6> *)local_2c0);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar21 = &dStack_2a0;
  lVar22 = 0;
  local_570 = auVar28._0_8_;
  dStack_568 = auVar28._8_8_;
  do {
    dVar52 = (double)local_550 * pdVar21[-4] +
             (double)local_560._0_8_ * pdVar21[-2] + local_570 * *pdVar21;
    dVar58 = dStack_548 * pdVar21[-3] +
             (double)local_560._8_8_ * pdVar21[-1] + dStack_568 * pdVar21[1];
    auVar38._0_8_ = dVar52 + dVar58;
    auVar38._8_8_ = dVar52 + dVar58;
    dVar52 = (double)vmovlpd_avx(auVar38);
    local_4e0[lVar22] = dVar52;
    lVar22 = lVar22 + 1;
    pdVar21 = pdVar21 + 6;
  } while (lVar22 != 6);
  local_2e8 = local_460 + 2;
  local_460[2] = local_4e0[0];
  dStack_430 = local_4e0[1];
  adStack_418[1] = local_4e0[2];
  local_428 = local_4e0[3];
  adStack_418[0] = local_4e0[3];
  local_460[4] = local_4e0[4];
  local_420 = local_4e0[4];
  local_460[3] = local_4e0[5];
  local_460[5] = local_4e0[5];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dStack_520;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_500;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_518;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_518 * dStack_508;
  auVar28 = vfmsub231sd_fma(auVar61,auVar39,auVar47);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_540[1];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_540[2] * dStack_508;
  auVar27 = vfmsub231sd_fma(auVar50,auVar63,auVar47);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_540[2] * dStack_520;
  auVar24 = vfmsub231sd_fma(auVar40,auVar63,auVar55);
  local_2d0 = auVar24._0_8_ * local_510 +
              (auVar28._0_8_ * local_540[0] - auVar27._0_8_ * local_540[3]);
  local_2f0 = (assign_op<double,_double> *)local_540;
  local_2e0 = (assign_op<double,_double> *)local_540;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (&local_188,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_2f0);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) *
       (local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar28 = vfmadd231sd_fma(auVar41,auVar56,auVar56);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar28 = vfmadd213sd_fma(auVar48,auVar48,auVar28);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar27 = vfmadd231sd_fma(auVar57,auVar42,auVar42);
  auVar27 = vfmadd231sd_fma(auVar27,auVar51,auVar51);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar27._0_8_ * 3.0;
  auVar28 = vfmadd231sd_fma(auVar43,auVar28,ZEXT816(0x3fe0000000000000));
  if (auVar28._0_8_ < 0.0) {
    dVar52 = sqrt(auVar28._0_8_);
  }
  else {
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar52 = auVar28._0_8_;
  }
  return dVar52;
}

Assistant:

double ChElementBeamANCF_3243::GetVonMissesStress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}